

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* __thiscall duckdb_re2::Regexp::NamedCaptures_abi_cxx11_(Regexp *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar1;
  NamedCapturesWalker w;
  NamedCapturesWalker local_78;
  
  local_78.super_Walker<int>._vptr_Walker = (_func_int **)&PTR__Walker_0246edf0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78.super_Walker<int>.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>::
  _M_initialize_map((_Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                     *)&local_78.super_Walker<int>.stack_,0);
  local_78.super_Walker<int>.stopped_early_ = false;
  local_78.super_Walker<int>._vptr_Walker = (_func_int **)&PTR__NamedCapturesWalker_0246ee30;
  local_78.map_ =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *)0x0;
  local_78.super_Walker<int>.max_visits_ = 1000000;
  Walker<int>::WalkInternal(&local_78.super_Walker<int>,this,0,true);
  pmVar1 = local_78.map_;
  local_78.map_ =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *)0x0;
  NamedCapturesWalker::~NamedCapturesWalker(&local_78);
  return pmVar1;
}

Assistant:

std::map<std::string, int>* Regexp::NamedCaptures() {
  NamedCapturesWalker w;
  w.Walk(this, 0);
  return w.TakeMap();
}